

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O0

void __thiscall
CalculationVisitor::visit
          (CalculationVisitor *this,Expression *parent,VariableExpression *expression)

{
  Environment *this_00;
  bool bVar1;
  runtime_error *this_01;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  undefined1 local_48 [8];
  ResultValue value;
  VariableExpression *expression_local;
  Expression *parent_local;
  CalculationVisitor *this_local;
  
  value.mComplexValue._M_value._8_8_ = expression;
  ResultValue::ResultValue((ResultValue *)local_48);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_
            (&local_68,(VariableExpression *)value.mComplexValue._M_value._8_8_);
  bVar1 = Environment::getVariable(this_00,&local_68,(ResultValue *)local_48,true);
  std::__cxx11::string::~string((string *)&local_68);
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    VariableExpression::name_abi_cxx11_
              (&local_d8,(VariableExpression *)value.mComplexValue._M_value._8_8_);
    std::operator+(&local_b8,"\'",&local_d8);
    std::operator+(&local_98,&local_b8,
                   "\' is not a defined variable. Type \':help\' for a list of commands.");
    std::runtime_error::runtime_error(this_01,(string *)&local_98);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::stack<ResultValue,_std::deque<ResultValue,_std::allocator<ResultValue>_>_>::push
            (&this->mEvaluationStack,(value_type *)local_48);
  return;
}

Assistant:

void CalculationVisitor::visit(Expression* parent, VariableExpression* expression) {
	ResultValue value;
	if (mEnvironment.getVariable(expression->name(), value, true)) {
		mEvaluationStack.push(value);
	} else {
		throw std::runtime_error("'" + expression->name() + "' is not a defined variable. Type ':help' for a list of commands.");
	}
}